

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dthinker.cpp
# Opt level: O1

int AF_DThinkerIterator_Reinit
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  undefined8 *puVar1;
  PClass *pPVar2;
  undefined8 uVar3;
  PClass *pPVar4;
  DThinker *pDVar5;
  char *__assertion;
  bool bVar6;
  
  pPVar2 = DThinkerIterator::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      puVar1 = (undefined8 *)(param->field_0).field_1.a;
      if (puVar1 != (undefined8 *)0x0) {
        if (puVar1[1] == 0) {
          uVar3 = (**(code **)*puVar1)(puVar1);
          puVar1[1] = uVar3;
        }
        pPVar4 = (PClass *)puVar1[1];
        bVar6 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar2 && bVar6) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar6 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar2) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar6) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(DThinkerIterator))";
          goto LAB_00381783;
        }
      }
      pDVar5 = FThinkerList::GetHead(DThinker::Thinkers + *(byte *)(puVar1 + 7));
      puVar1[6] = pDVar5;
      *(undefined1 *)((long)puVar1 + 0x3a) = 0;
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_00381783:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dthinker.cpp"
                ,0x2de,
                "int AF_DThinkerIterator_Reinit(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(DThinkerIterator, Reinit)
{
	PARAM_SELF_PROLOGUE(DThinkerIterator);
	self->Reinit();
	return 0;
}